

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

void __thiscall wabt::interp::Store::Mark(Store *this,RefVec *refs)

{
  pointer pRVar1;
  Ref *ref;
  pointer pRVar2;
  
  pRVar1 = (refs->super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  for (pRVar2 = (refs->super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>).
                _M_impl.super__Vector_impl_data._M_start; pRVar2 != pRVar1; pRVar2 = pRVar2 + 1) {
    Mark(this,(Ref)pRVar2->index);
  }
  return;
}

Assistant:

void Store::Mark(const RefVec& refs) {
  for (auto&& ref: refs) {
    Mark(ref);
  }
}